

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_bind.cpp
# Opt level: O0

int __thiscall FKeyBindings::GetKeysForCommand(FKeyBindings *this,char *cmd,int *first,int *second)

{
  int iVar1;
  char *__s2;
  int local_30;
  int local_2c;
  int i;
  int c;
  int *second_local;
  int *first_local;
  char *cmd_local;
  FKeyBindings *this_local;
  
  local_30 = 0;
  local_2c = 0;
  *second = 0;
  *first = 0;
  for (; local_30 < 0x1c4 && local_2c < 2; local_30 = local_30 + 1) {
    __s2 = FString::operator_cast_to_char_(this->Binds + local_30);
    iVar1 = strcasecmp(cmd,__s2);
    if (iVar1 == 0) {
      if (local_2c == 0) {
        *first = local_30;
        local_2c = local_2c + 1;
      }
      else {
        *second = local_30;
        local_2c = local_2c + 1;
      }
    }
  }
  return local_2c;
}

Assistant:

int FKeyBindings::GetKeysForCommand (const char *cmd, int *first, int *second)
{
	int c, i;

	*first = *second = c = i = 0;

	while (i < NUM_KEYS && c < 2)
	{
		if (stricmp (cmd, Binds[i]) == 0)
		{
			if (c++ == 0)
				*first = i;
			else
				*second = i;
		}
		i++;
	}
	return c;
}